

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

Real V_GetCmp(Vector *V,size_t Ind)

{
  LASErrIdType LVar1;
  Real RVar2;
  
  LVar1 = LASResult();
  RVar2 = 0.0;
  if (LVar1 == LASOK) {
    if ((Ind == 0) || (V->Dim < Ind)) {
      LASError(LASRangeErr,"V_GetCmp",V->Name,(char *)0x0,(char *)0x0);
      RVar2 = 0.0;
    }
    else {
      RVar2 = V->Cmp[Ind];
    }
  }
  return RVar2;
}

Assistant:

Real V_GetCmp(Vector *V, size_t Ind)
/* returns the value of a vector component */
{
    Real Val;

    if (LASResult() == LASOK) {
        if (Ind > 0 && Ind <= V->Dim) {
            Val = V->Cmp[Ind];
        } else {
            LASError(LASRangeErr, "V_GetCmp", V->Name, NULL, NULL);
            Val = 0.0;
        }
    } else {
        Val = 0.0;
    }
    return(Val);
}